

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_simplify_intmul_k64(jit_State *J)

{
  IRIns IVar1;
  TRef TVar2;
  
  IVar1 = (J->fold).right[1];
  if ((ulong)IVar1 < 0x80000000) {
    TVar2 = simplify_intmul_k(J,IVar1.i);
    return TVar2;
  }
  return 0;
}

Assistant:

LJFOLD(MUL any KINT64)
LJFOLDF(simplify_intmul_k64)
{
#if LJ_HASFFI
  if (ir_kint64(fright)->u64 < 0x80000000u)
    return simplify_intmul_k(J, (int32_t)ir_kint64(fright)->u64);
  return NEXTFOLD;
#else
  UNUSED(J); lj_assertJ(0, "FFI IR op without FFI"); return FAILFOLD;
#endif
}